

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo)

{
  Vdbe *p;
  uint uVar1;
  undefined1 *in_RDX;
  int in_ESI;
  long *in_RDI;
  int j;
  ExprList_item *pItem;
  CollSeq *pColl;
  ExprList *pList;
  int regAgg;
  int addrNext;
  int nArg;
  AggInfo_col *pC;
  AggInfo_func *pF;
  int addrHitTest;
  int regHit;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Parse *in_stack_ffffffffffffff98;
  Parse *in_stack_ffffffffffffffa0;
  Vdbe *p_00;
  int in_stack_ffffffffffffffb0;
  int x;
  ushort uVar2;
  int iVar3;
  Parse *in_stack_ffffffffffffffc0;
  ExprList *pList_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  int local_28;
  int local_24;
  
  p = (Vdbe *)in_RDI[2];
  local_28 = 0;
  iVar4 = 0;
  *in_RDX = 1;
  local_24 = 0;
  pList_00 = *(ExprList **)(in_RDX + 0x30);
  for (; local_24 < *(int *)(in_RDX + 0x38); local_24 = local_24 + 1) {
    x = 0;
    p_00 = *(Vdbe **)(*(char **)pList_00 + 0x20);
    if (p_00 == (Vdbe *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = *(int *)&p_00->db;
      sqlite3GetTempRange(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      sqlite3ExprCodeExprList
                ((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),pList_00,
                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                 (u8)((uint)iVar3 >> 0x18));
    }
    if (-1 < *(int *)((long)&pList_00->a[0].zName + 4)) {
      x = sqlite3VdbeMakeLabel
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      codeDistinct(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (int)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                   in_stack_ffffffffffffff90);
    }
    if (((pList_00->a[0].pExpr)->flags & 0x20) != 0) {
      in_stack_ffffffffffffffa0 = (Parse *)0x0;
      in_stack_ffffffffffffff94 = 0;
      in_stack_ffffffffffffff98 = (Parse *)&p_00->pPrev;
      while( true ) {
        uVar1 = in_stack_ffffffffffffff90 & 0xffffff;
        if (in_stack_ffffffffffffffa0 == (Parse *)0x0) {
          uVar1 = CONCAT13(in_stack_ffffffffffffff94 < iVar3,(int3)in_stack_ffffffffffffff90);
        }
        in_stack_ffffffffffffff90 = uVar1;
        if ((char)(in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
        in_stack_ffffffffffffffa0 =
             (Parse *)sqlite3ExprCollSeq(in_stack_ffffffffffffffc0,(Expr *)CONCAT44(iVar3,x));
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1;
        in_stack_ffffffffffffff98 = (Parse *)&in_stack_ffffffffffffff98->isMultiWrite;
      }
      if (in_stack_ffffffffffffffa0 == (Parse *)0x0) {
        in_stack_ffffffffffffffa0 = *(Parse **)(*in_RDI + 0x10);
      }
      if ((local_28 == 0) && (*(int *)(in_RDX + 0x2c) != 0)) {
        local_28 = (int)in_RDI[7] + 1;
        *(int *)(in_RDI + 7) = local_28;
      }
      in_stack_ffffffffffffff88 = -2;
      sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        in_stack_ffffffffffffff90,
                        (char *)CONCAT44(in_stack_ffffffffffffff8c,0xfffffffe),
                        in_stack_ffffffffffffffb0);
    }
    uVar2 = (ushort)iVar3;
    sqlite3VdbeAddOp3(p_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (int)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                      ,(int)in_stack_ffffffffffffff98);
    sqlite3VdbeAppendP4((Vdbe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff94);
    sqlite3VdbeChangeP5(p,uVar2 & 0xff);
    sqlite3ReleaseTempRange
              ((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    if (x != 0) {
      sqlite3VdbeResolveLabel(p,x);
    }
    pList_00 = (ExprList *)&pList_00->a[0].zSpan;
  }
  if ((local_28 == 0) && (*(int *)(in_RDX + 0x2c) != 0)) {
    local_28 = in_ESI;
  }
  if (local_28 != 0) {
    iVar4 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  for (local_24 = 0; local_24 < *(int *)(in_RDX + 0x2c); local_24 = local_24 + 1) {
    sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  }
  *in_RDX = 0;
  if (iVar4 != 0) {
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c);
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, int regAcc, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}